

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall SQCompilation::CheckerVisitor::checkCanReturnNull(CheckerVisitor *this,BinExpr *bin)

{
  TreeOp TVar1;
  SQChar *n;
  bool bVar2;
  long lVar3;
  Node *pNVar4;
  FunctionInfo *pFVar5;
  Expr *pEVar6;
  Node *n_00;
  Node *pNVar7;
  SQChar **ppSVar8;
  bool isCtor;
  bool local_29;
  int32_t local_28;
  int32_t local_24;
  
  if (this->effectsOnly == false) {
    TVar1 = (bin->super_Expr).super_Node._op;
    if ((((ulong)TVar1 < 0x31) && ((0x1f7f800000000U >> ((ulong)TVar1 & 0x3f) & 1) != 0)) ||
       (TVar1 - TO_3CMP < 5)) {
      for (pEVar6 = bin->_lhs; pEVar6 != (Expr *)0x0;
          pEVar6 = *(Expr **)((long)&(pEVar6->super_Node).super_ArenaObj._vptr_ArenaObj + lVar3)) {
        TVar1 = (pEVar6->super_Node)._op;
        lVar3 = 0x28;
        if ((TVar1 != TO_INC) && (lVar3 = 0x20, 7 < TVar1 - TO_NOT)) goto LAB_00150d44;
      }
      pEVar6 = (Expr *)0x0;
LAB_00150d44:
      n_00 = (Node *)0x0;
      pNVar4 = &maybeEval(this,pEVar6,&local_28,false)->super_Node;
      if (pNVar4 != (Node *)0x0) {
        do {
          n_00 = pNVar4;
          lVar3 = 0x28;
          if ((n_00->_op != TO_INC) && (lVar3 = 0x20, 7 < n_00->_op - TO_NOT)) goto LAB_00150d85;
          pNVar4 = *(Node **)((long)&(((Node *)&n_00->super_ArenaObj)->super_ArenaObj).
                                     _vptr_ArenaObj + lVar3);
        } while (pNVar4 != (Node *)0x0);
        n_00 = (Node *)0x0;
      }
LAB_00150d85:
      for (pEVar6 = bin->_rhs; pEVar6 != (Expr *)0x0;
          pEVar6 = *(Expr **)((long)&(pEVar6->super_Node).super_ArenaObj._vptr_ArenaObj + lVar3)) {
        TVar1 = (pEVar6->super_Node)._op;
        lVar3 = 0x28;
        if ((TVar1 != TO_INC) && (lVar3 = 0x20, 7 < TVar1 - TO_NOT)) goto LAB_00150db0;
      }
      pEVar6 = (Expr *)0x0;
LAB_00150db0:
      pNVar7 = (Node *)0x0;
      pNVar4 = &maybeEval(this,pEVar6,&local_24,false)->super_Node;
      if (pNVar4 != (Node *)0x0) {
        do {
          pNVar7 = pNVar4;
          lVar3 = 0x28;
          if ((pNVar7->_op != TO_INC) && (lVar3 = 0x20, 7 < pNVar7->_op - TO_NOT))
          goto LAB_00150df1;
          pNVar4 = *(Node **)((long)&(((Node *)&pNVar7->super_ArenaObj)->super_ArenaObj).
                                     _vptr_ArenaObj + lVar3);
        } while (pNVar4 != (Node *)0x0);
        pNVar7 = (Node *)0x0;
      }
LAB_00150df1:
      if ((n_00->_op == TO_CALL) || (n_00 = pNVar7, pNVar7->_op == TO_CALL)) {
        pEVar6 = (Expr *)n_00[1].super_ArenaObj._vptr_ArenaObj;
        local_29 = false;
        pFVar5 = findFunctionInfo(this,pEVar6,&local_29);
        if (local_29 == false) {
          if (pFVar5 == (FunctionInfo *)0x0) {
            TVar1 = (pEVar6->super_Node)._op;
            if (TVar1 == TO_GETFIELD) {
              ppSVar8 = (SQChar **)&pEVar6[1].super_Node._coordinates.lineEnd;
            }
            else {
              if (TVar1 != TO_ID) {
                return;
              }
              ppSVar8 = (SQChar **)(pEVar6 + 1);
            }
          }
          else {
            ppSVar8 = &pFVar5->declaration->_name;
          }
          n = *ppSVar8;
          if ((n != (SQChar *)0x0) && (bVar2 = canFunctionReturnNull(n), bVar2)) {
            report(this,n_00,0x5e,n);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkCanReturnNull(const BinExpr *bin) {
  if (effectsOnly)
    return;


  if (!isPureArithOperator(bin->op()) && !isRelationOperator(bin->op())) {
    return;
  }

  const Expr *l = skipUnary(maybeEval(skipUnary(bin->lhs())));
  const Expr *r = skipUnary(maybeEval(skipUnary(bin->rhs())));
  const CallExpr *c = nullptr;

  if (l->op() == TO_CALL) // -V522
    c = static_cast<const CallExpr *>(l);
  else if (r->op() == TO_CALL) // -V522
    c = static_cast<const CallExpr *>(r);

  if (!c)
    return;

  const Expr *callee = c->callee();
  bool isCtor = false;
  const FunctionInfo *info = findFunctionInfo(callee, isCtor);

  if (isCtor)
    return;

  const SQChar *funcName = nullptr;

  if (info) {
    funcName = info->declaration->name();
  }
  else if (callee->op() == TO_ID) {
    funcName = callee->asId()->id();
  }
  else if (callee->op() == TO_GETFIELD) {
    funcName = callee->asGetField()->fieldName();
  }

  if (funcName) {
    if (canFunctionReturnNull(funcName)) {
      report(c, DiagnosticsId::DI_FUNC_CAN_RET_NULL, funcName);
    }
  }
}